

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O3

void __thiscall mp::BasicSolver::ParseOptionString(BasicSolver *this,char *s,uint flags)

{
  ulong size;
  char cVar1;
  int iVar2;
  SolverOption *pSVar3;
  long *plVar4;
  long lVar5;
  long *plVar6;
  char *pcVar7;
  char *pcVar8;
  long lVar9;
  char *pcVar10;
  Type array;
  Type array_1;
  MemoryBuffer<char,_50UL,_std::allocator<char>_> name;
  char *local_108;
  uint local_fc;
  char *local_f8;
  anon_union_8_2_de49483c_for_ArgList_1 aStack_f0;
  long local_e8;
  long lStack_e0;
  ArgList local_d8;
  long local_c8 [2];
  ArgList local_b8;
  SolverOptionManager *local_a0;
  MemoryBuffer<char,_50UL,_std::allocator<char>_> local_98;
  ArgList local_40;
  
  local_a0 = &this->super_SolverOptionManager;
  local_108 = s;
  local_fc = flags;
  do {
    cVar1 = *local_108;
    pcVar10 = local_108;
    while ((cVar1 != '\0' && (iVar2 = isspace((int)cVar1), iVar2 != 0))) {
      cVar1 = pcVar10[1];
      pcVar10 = pcVar10 + 1;
    }
    cVar1 = *pcVar10;
    if (cVar1 == '\0') {
      return;
    }
    pcVar8 = pcVar10 + 1;
    local_108 = pcVar10;
    do {
      pcVar7 = pcVar8;
      iVar2 = isspace((int)cVar1);
      pcVar8 = pcVar7;
      if ((cVar1 == '=') || (iVar2 != 0)) break;
      cVar1 = *pcVar7;
      pcVar8 = pcVar7 + 1;
      local_108 = pcVar7;
    } while (cVar1 != '\0');
    local_98.super_Buffer<char>.ptr_ = local_98.data_;
    local_98.super_Buffer<char>.size_ = 0;
    local_98.super_Buffer<char>.capacity_ = 0x32;
    local_98.super_Buffer<char>._vptr_Buffer = (_func_int **)&PTR_grow_005d4b00;
    lVar9 = (long)(pcVar8 + -1) - (long)pcVar10;
    size = lVar9 + 1;
    if (0x32 < size) {
      fmt::internal::MemoryBuffer<char,_50UL,_std::allocator<char>_>::grow(&local_98,size);
    }
    if (pcVar8 + -1 != pcVar10) {
      lVar5 = 0;
      do {
        local_98.super_Buffer<char>.ptr_[lVar5] = pcVar10[lVar5];
        lVar5 = lVar5 + 1;
      } while (lVar9 + (ulong)(lVar9 == 0) != lVar5);
    }
    local_98.super_Buffer<char>.ptr_[lVar9] = '\0';
    cVar1 = *local_108;
    pcVar10 = local_108;
    local_98.super_Buffer<char>.size_ = size;
    while ((cVar1 != '\0' && (iVar2 = isspace((int)cVar1), iVar2 != 0))) {
      cVar1 = pcVar10[1];
      pcVar10 = pcVar10 + 1;
    }
    cVar1 = *pcVar10;
    local_108 = pcVar10;
    if (cVar1 == '=') {
      do {
        pcVar8 = pcVar10 + 1;
        pcVar10 = pcVar10 + 1;
        if (*pcVar8 == '\0') break;
        iVar2 = isspace((int)*pcVar8);
      } while (iVar2 != 0);
    }
    local_108 = pcVar10;
    pSVar3 = SolverOptionManager::FindOption(local_a0,local_98.super_Buffer<char>.ptr_,true);
    pcVar10 = local_108;
    if (pSVar3 == (SolverOption *)0x0) {
      (*(this->super_ErrorHandler)._vptr_ErrorHandler[6])(this,local_98.super_Buffer<char>.ptr_);
      pcVar10 = local_108;
    }
    else if ((*local_108 == '?') &&
            ((local_108[1] == '\0' || (iVar2 = isspace((int)local_108[1]), iVar2 != 0)))) {
      local_108 = pcVar10 + 1;
      pcVar10 = local_108;
      if ((local_fc & 1) == 0) {
        (*pSVar3->_vptr_SolverOption[0xb])(&local_f8,pSVar3);
        local_d8.types_ = (uint64_t)local_f8;
        local_d8.field_1 = aStack_f0;
        local_b8.types_ = 0xb;
        local_b8.field_1.values_ = (Value *)&local_d8;
        Print(this,(CStringRef)0x4bafeb,&local_b8);
        lVar9 = local_e8;
        pcVar8 = local_f8;
        pcVar10 = local_108;
        if ((long *)local_f8 != &local_e8) {
LAB_00465e62:
          operator_delete(pcVar8,lVar9 + 1);
          pcVar10 = local_108;
        }
      }
    }
    else {
      if (cVar1 == '=') {
        iVar2 = (*pSVar3->_vptr_SolverOption[2])(pSVar3);
        if ((char)iVar2 != '\0') {
          local_f8 = local_98.super_Buffer<char>.ptr_;
          local_d8.types_ = 10;
          local_d8.field_1.values_ = (Value *)&local_f8;
          ReportError(this,(CStringRef)0x4baf8a,&local_d8);
          cVar1 = *local_108;
          pcVar10 = local_108;
          while ((cVar1 != '\0' && (iVar2 = isspace((int)cVar1), iVar2 == 0))) {
            cVar1 = pcVar10[1];
            pcVar10 = pcVar10 + 1;
          }
          goto LAB_00465e6a;
        }
      }
      else {
        (*pSVar3->_vptr_SolverOption[2])(pSVar3);
      }
      (*pSVar3->_vptr_SolverOption[0xd])(pSVar3,&local_108,(ulong)((local_fc & 2) >> 1));
      pcVar10 = local_108;
      if ((local_fc & 1) == 0) {
        (*pSVar3->_vptr_SolverOption[0xb])(&local_d8,pSVar3);
        plVar4 = (long *)std::__cxx11::string::_M_replace_aux
                                   ((ulong)&local_d8,(ulong)local_d8.field_1,0,'\x01');
        local_f8 = (char *)&local_e8;
        plVar6 = plVar4 + 2;
        if ((long *)*plVar4 == plVar6) {
          local_e8 = *plVar6;
          lStack_e0 = plVar4[3];
        }
        else {
          local_e8 = *plVar6;
          local_f8 = (char *)*plVar4;
        }
        aStack_f0 = *(anon_union_8_2_de49483c_for_ArgList_1 *)(plVar4 + 1);
        *plVar4 = (long)plVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        local_b8.types_ = (uint64_t)local_f8;
        local_40.types_ = 0xb;
        local_40.field_1.values_ = (Value *)&local_b8;
        local_b8.field_1 = aStack_f0;
        Print(this,(CStringRef)0x4baef0,&local_40);
        if ((long *)local_f8 != &local_e8) {
          operator_delete(local_f8,local_e8 + 1);
        }
        lVar9 = local_c8[0];
        pcVar8 = (char *)local_d8.types_;
        pcVar10 = local_108;
        if ((long *)local_d8.types_ != local_c8) goto LAB_00465e62;
      }
    }
LAB_00465e6a:
    local_108 = pcVar10;
    local_98.super_Buffer<char>._vptr_Buffer = (_func_int **)&PTR_grow_005d4b00;
    if (local_98.super_Buffer<char>.ptr_ != local_98.data_) {
      operator_delete(local_98.super_Buffer<char>.ptr_,local_98.super_Buffer<char>.capacity_);
    }
  } while( true );
}

Assistant:

void BasicSolver::ParseOptionString(
    const char *s, unsigned flags) {
  for (;;) {
    if (!*(s = SkipSpaces(s)))
      return;

    // Parse the option name.
    const char *name_start = s;
    while (*s && !std::isspace(*s) && *s != '=')
      ++s;
    fmt::internal::MemoryBuffer<char, 50> name;
    std::size_t name_size = s - name_start;
    name.resize(name_size + 1);
    for (std::size_t i = 0; i < name_size; ++i)
      name[i] = name_start[i];
    name[name_size] = 0;

    // Check if we have an '=' sign,
    // skip all spaces intil next token.
    bool equal_sign = false;
    s = SkipSpaces(s);
    if (*s == '=') {
      s = SkipSpaces(s + 1);
      equal_sign = true;
    }

    // Parse option name.
    SolverOption *opt = FindOption(&name[0], true);
    if (!opt) {
      HandleUnknownOption(&name[0]);
      continue;       // in case it does not throw
    }

    // If user asks the default/current value.
    if (*s == '?') {
      char next = s[1];
      if (!next || std::isspace(next)) {
        ++s;
        if ((flags & NO_OPTION_ECHO) == 0) {
          Print("  {}\n", opt->echo_with_value());
        }
        continue;
      }
    }

    /// Parse value if needed.
    if (equal_sign) {
      // No '=' for flags.
      if (opt->is_flag()) {
        ReportError(
              "Option \"{}\" doesn't accept an argument",
              &name[0]);
        s = SkipNonSpaces(s);    // In case we go on
        continue;
      } else {
        opt->Parse(s, flags & FROM_COMMAND_LINE);
      }
    } else {
      if (opt->is_flag()) {         // Might set some flag
        opt->Parse(s, flags & FROM_COMMAND_LINE);
      } else {                      // Even w/o '=' sign
        opt->Parse(s, flags & FROM_COMMAND_LINE);
      }
    }

    // Echo name [= value].
    if ((flags & NO_OPTION_ECHO) == 0) {
      Print("  {}", opt->echo_with_value() + '\n');
    }
  }
}